

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-curse.c
# Opt level: O0

wchar_t lookup_curse(char *name)

{
  int iVar1;
  curse *curse;
  wchar_t i;
  char *name_local;
  
  curse._4_4_ = L'\x01';
  while( true ) {
    if ((int)(uint)z_info->curse_max <= curse._4_4_) {
      return L'\0';
    }
    if ((curses[curse._4_4_].name != (char *)0x0) &&
       (iVar1 = strcmp(name,curses[curse._4_4_].name), iVar1 == 0)) break;
    curse._4_4_ = curse._4_4_ + L'\x01';
  }
  return curse._4_4_;
}

Assistant:

int lookup_curse(const char *name)
{
	int i;

	for (i = 1; i < z_info->curse_max; i++) {
		struct curse *curse = &curses[i];
		if (curse->name && streq(name, curse->name))
			return i;
	}
	return 0;
}